

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FoundationPileColliderTests.cpp
# Opt level: O1

void __thiscall
solitaire::colliders::FoundationPileColliderTests_collidesWithCard_Test::
FoundationPileColliderTests_collidesWithCard_Test
          (FoundationPileColliderTests_collidesWithCard_Test *this)

{
  testing::Test::Test((Test *)this);
  (this->super_FoundationPileColliderTests).super_Test._vptr_Test =
       (_func_int **)&PTR__FoundationPileColliderTests_00325f38;
  FoundationPileCollider::FoundationPileCollider
            (&(this->super_FoundationPileColliderTests).collider,
             (Position *)&(anonymous_namespace)::topLeftCorner);
  (this->super_FoundationPileColliderTests).super_Test._vptr_Test =
       (_func_int **)&PTR__FoundationPileColliderTests_00325e88;
  return;
}

Assistant:

TEST_F(FoundationPileColliderTests, collidesWithCard) {
    EXPECT_FALSE(collider.collidesWithCardsInHand(topLeftCorner - Position {cardSize.width, 0}));
    EXPECT_FALSE(collider.collidesWithCardsInHand(topLeftCorner - Position {0, cardSize.height}));
    EXPECT_FALSE(collider.collidesWithCardsInHand(topLeftCorner + Position {cardSize.width, 0}));
    EXPECT_FALSE(collider.collidesWithCardsInHand(topLeftCorner + Position {0, cardSize.height}));

    EXPECT_TRUE(collider.collidesWithCardsInHand(
        topLeftCorner - Position {cardSize.width - 1, cardSize.height - 1}));
    EXPECT_TRUE(collider.collidesWithCardsInHand(bottomRightCorner));
}